

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O0

ze_result_t zeGetContextProcAddrTable(ze_api_version_t version,ze_context_dditable_t *pDdiTable)

{
  ze_api_version_t *pzVar1;
  ze_result_t result;
  ze_context_dditable_t *dditable;
  ze_context_dditable_t *pDdiTable_local;
  ze_api_version_t version_local;
  
  pzVar1 = validation_layer::context;
  if (pDdiTable == (ze_context_dditable_t *)0x0) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (((int)*validation_layer::context >> 0x10 == (int)version >> 0x10) &&
          ((*validation_layer::context & 0xffff) <= (version & 0xffff))) {
    *(ze_pfnContextCreate_t *)(validation_layer::context + 0x68) = pDdiTable->pfnCreate;
    pDdiTable->pfnCreate = validation_layer::zeContextCreate;
    *(ze_pfnContextDestroy_t *)(pzVar1 + 0x6a) = pDdiTable->pfnDestroy;
    pDdiTable->pfnDestroy = validation_layer::zeContextDestroy;
    *(ze_pfnContextGetStatus_t *)(pzVar1 + 0x6c) = pDdiTable->pfnGetStatus;
    pDdiTable->pfnGetStatus = validation_layer::zeContextGetStatus;
    *(ze_pfnContextSystemBarrier_t *)(pzVar1 + 0x6e) = pDdiTable->pfnSystemBarrier;
    pDdiTable->pfnSystemBarrier = validation_layer::zeContextSystemBarrier;
    *(ze_pfnContextMakeMemoryResident_t *)(pzVar1 + 0x70) = pDdiTable->pfnMakeMemoryResident;
    pDdiTable->pfnMakeMemoryResident = validation_layer::zeContextMakeMemoryResident;
    *(ze_pfnContextEvictMemory_t *)(pzVar1 + 0x72) = pDdiTable->pfnEvictMemory;
    pDdiTable->pfnEvictMemory = validation_layer::zeContextEvictMemory;
    *(ze_pfnContextMakeImageResident_t *)(pzVar1 + 0x74) = pDdiTable->pfnMakeImageResident;
    pDdiTable->pfnMakeImageResident = validation_layer::zeContextMakeImageResident;
    *(ze_pfnContextEvictImage_t *)(pzVar1 + 0x76) = pDdiTable->pfnEvictImage;
    pDdiTable->pfnEvictImage = validation_layer::zeContextEvictImage;
    *(ze_pfnContextCreateEx_t *)(pzVar1 + 0x78) = pDdiTable->pfnCreateEx;
    pDdiTable->pfnCreateEx = validation_layer::zeContextCreateEx;
    pDdiTable_local._4_4_ = ZE_RESULT_SUCCESS;
  }
  else {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
  }
  return pDdiTable_local._4_4_;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetContextProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_context_dditable_t* pDdiTable                ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = validation_layer::context.zeDdiTable.Context;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(validation_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(validation_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnCreate                                   = pDdiTable->pfnCreate;
    pDdiTable->pfnCreate                                 = validation_layer::zeContextCreate;

    dditable.pfnDestroy                                  = pDdiTable->pfnDestroy;
    pDdiTable->pfnDestroy                                = validation_layer::zeContextDestroy;

    dditable.pfnGetStatus                                = pDdiTable->pfnGetStatus;
    pDdiTable->pfnGetStatus                              = validation_layer::zeContextGetStatus;

    dditable.pfnSystemBarrier                            = pDdiTable->pfnSystemBarrier;
    pDdiTable->pfnSystemBarrier                          = validation_layer::zeContextSystemBarrier;

    dditable.pfnMakeMemoryResident                       = pDdiTable->pfnMakeMemoryResident;
    pDdiTable->pfnMakeMemoryResident                     = validation_layer::zeContextMakeMemoryResident;

    dditable.pfnEvictMemory                              = pDdiTable->pfnEvictMemory;
    pDdiTable->pfnEvictMemory                            = validation_layer::zeContextEvictMemory;

    dditable.pfnMakeImageResident                        = pDdiTable->pfnMakeImageResident;
    pDdiTable->pfnMakeImageResident                      = validation_layer::zeContextMakeImageResident;

    dditable.pfnEvictImage                               = pDdiTable->pfnEvictImage;
    pDdiTable->pfnEvictImage                             = validation_layer::zeContextEvictImage;

    dditable.pfnCreateEx                                 = pDdiTable->pfnCreateEx;
    pDdiTable->pfnCreateEx                               = validation_layer::zeContextCreateEx;

    return result;
}